

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  char16_t cVar1;
  QChar *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  char16_t local_38 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>_>
  ::appendTo<QChar>((type *)p,out);
  builtin_memcpy(local_38,L"0123456789abcdef",0x20);
  pQVar2 = *out + 1;
  lVar3 = 0;
  do {
    cVar1 = local_38[*(byte *)((long)&(p->a).b.val + lVar3) & 0xf];
    *out = pQVar2;
    pQVar2[-1].ucs = cVar1;
    cVar1 = local_38[*(byte *)((long)&(p->a).b.val + lVar3) >> 4];
    *out = pQVar2 + 1;
    pQVar2->ucs = cVar1;
    pQVar2 = pQVar2 + 2;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  builtin_memcpy(local_38,L"0123456789abcdef",0x20);
  lVar3 = 0;
  do {
    cVar1 = local_38[*(byte *)((long)&(p->b).val + lVar3) & 0xf];
    *out = pQVar2;
    pQVar2[-1].ucs = cVar1;
    cVar1 = local_38[*(byte *)((long)&(p->b).val + lVar3) >> 4];
    *out = pQVar2 + 1;
    pQVar2->ucs = cVar1;
    lVar3 = lVar3 + 1;
    pQVar2 = pQVar2 + 2;
  } while ((int)lVar3 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }